

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::FileDescriptor::GetSourceLocation
          (FileDescriptor *this,vector<int,_std::allocator<int>_> *path,SourceLocation *out_location
          )

{
  RepeatedPtrFieldBase *this_00;
  int iVar1;
  long lVar2;
  pointer piVar3;
  Type *pTVar4;
  int *piVar5;
  int i;
  ulong uVar6;
  RepeatedField<int> *this_01;
  int index;
  
  internal::CheckNotNull<google::protobuf::SourceLocation>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/descriptor.cc"
             ,1999,"\'out_location\' must not be NULL",out_location);
  lVar2 = *(long *)(this + 0x98);
  index = 0;
  if (lVar2 != 0) {
    this_00 = (RepeatedPtrFieldBase *)(lVar2 + 0x10);
    for (; index < *(int *)(lVar2 + 0x18); index = index + 1) {
      pTVar4 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
                         (this_00,index);
      if ((long)(path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2 == (long)(pTVar4->path_).current_size_) {
        uVar6 = 0;
        do {
          piVar3 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar6) {
            pTVar4 = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
                               (this_00,index);
            if ((pTVar4->span_).current_size_ - 3U < 2) {
              this_01 = &pTVar4->span_;
              piVar5 = RepeatedField<int>::Get(this_01,0);
              out_location->start_line = *piVar5;
              piVar5 = RepeatedField<int>::Get(this_01,1);
              out_location->start_column = *piVar5;
              piVar5 = RepeatedField<int>::Get
                                 (this_01,(uint)((pTVar4->span_).current_size_ != 3) * 2);
              out_location->end_line = *piVar5;
              piVar5 = RepeatedField<int>::Get(this_01,(pTVar4->span_).current_size_ + -1);
              out_location->end_column = *piVar5;
              internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
                        (this_00,index);
              std::__cxx11::string::_M_assign((string *)&out_location->leading_comments);
              internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
                        (this_00,index);
              std::__cxx11::string::_M_assign((string *)&out_location->trailing_comments);
              index = 1;
              goto LAB_001968c9;
            }
            break;
          }
          iVar1 = piVar3[uVar6];
          piVar5 = RepeatedField<int>::Get(&pTVar4->path_,(int)uVar6);
          uVar6 = uVar6 + 1;
        } while (iVar1 == *piVar5);
      }
    }
    index = 0;
  }
LAB_001968c9:
  return SUB41(index,0);
}

Assistant:

bool FileDescriptor::GetSourceLocation(const vector<int>& path,
                                       SourceLocation* out_location) const {
  GOOGLE_CHECK_NOTNULL(out_location);
  const SourceCodeInfo* info = source_code_info_;
  for (int i = 0; info && i < info->location_size(); ++i) {
    if (PathsEqual(path, info->location(i).path())) {
      const RepeatedField<int32>& span = info->location(i).span();
      if (span.size() == 3 || span.size() == 4) {
        out_location->start_line   = span.Get(0);
        out_location->start_column = span.Get(1);
        out_location->end_line     = span.Get(span.size() == 3 ? 0 : 2);
        out_location->end_column   = span.Get(span.size() - 1);

        out_location->leading_comments = info->location(i).leading_comments();
        out_location->trailing_comments = info->location(i).trailing_comments();
        return true;
      }
    }
  }
  return false;
}